

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeArrayConstructor
               (DynamicObject *arrayConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  undefined8 in_RAX;
  uint uVar3;
  RuntimeFunction *pRVar1;
  PropertyString *pPVar2;
  ScriptContext *pSVar4;
  ulong uVar5;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,arrayConstructor,mode,6,0);
  this = (((arrayConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar5 = (ulong)uVar3 << 0x20;
  (*(arrayConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayConstructor,0xd1,&DAT_1000000000001,2,0,0,uVar5);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(arrayConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (arrayConstructor,0x124,
             (((pSVar4->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             arrayPrototype.ptr,0,0,0,uVar5);
  pRVar1 = CreateGetterFunction
                     (this,0x2c6,(FunctionInfo *)JavascriptArray::EntryInfo::GetterSymbolSpecies);
  if (pRVar1 == (RuntimeFunction *)0x0) {
    pRVar1 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  (*(arrayConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x2d])(arrayConstructor,0x19,pRVar1);
  (*(arrayConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x3e])(arrayConstructor,0x19,6);
  pPVar2 = ScriptContext::GetPropertyString(pSVar4,0x4f);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(arrayConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayConstructor,0x106,pPVar2,2,0,0,uVar5);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(arrayConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (arrayConstructor,0xbe,(this->isArrayFunction).ptr,6,0,0,uVar5);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptArray::EntryInfo::From,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x95);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(arrayConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayConstructor,0x95,pRVar1,6,0,0,uVar5);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptArray::EntryInfo::Of,0,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x11c);
  pSVar4 = (ScriptContext *)0x11c;
  (*(arrayConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (arrayConstructor,0x11c,pRVar1,6,0,0,uVar5 & 0xffffffff00000000);
  CheckRegisteredBuiltIns((Type *)&this->field_0x650,pSVar4);
  DynamicObject::SetHasNoEnumerableProperties(arrayConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeArrayConstructor(DynamicObject* arrayConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(arrayConstructor, mode, 6);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterArray
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = arrayConstructor->GetScriptContext();
        JavascriptLibrary* library = arrayConstructor->GetLibrary();
        Field(JavascriptFunction*)* builtinFuncs = library->GetBuiltinFunctions();

        library->AddMember(arrayConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(arrayConstructor, PropertyIds::prototype, scriptContext->GetLibrary()->arrayPrototype, PropertyNone);
        library->AddSpeciesAccessorsToLibraryObject(arrayConstructor, &JavascriptArray::EntryInfo::GetterSymbolSpecies);
        library->AddMember(arrayConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Array), PropertyConfigurable);

#ifdef ENABLE_JS_BUILTINS
        library->AddMember(arrayConstructor, PropertyIds::isArray, library->isArrayFunction);
#else
        library->AddFunctionToLibraryObject(arrayConstructor, PropertyIds::isArray, &JavascriptArray::EntryInfo::IsArray, 1);
#endif

        library->AddFunctionToLibraryObject(arrayConstructor, PropertyIds::from, &JavascriptArray::EntryInfo::From, 1);
        library->AddFunctionToLibraryObject(arrayConstructor, PropertyIds::of, &JavascriptArray::EntryInfo::Of, 0);

        DebugOnly(CheckRegisteredBuiltIns(builtinFuncs, scriptContext));

        arrayConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }